

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_hash_compare(psa_algorithm_t alg,uint8_t *input,size_t input_length,uint8_t *hash,
                size_t hash_length)

{
  psa_status_t pVar1;
  psa_hash_operation_t operation;
  psa_hash_operation_t local_110;
  
  memset(&local_110,0,0xe0);
  pVar1 = psa_hash_setup(&local_110,alg);
  if (((pVar1 == 0) && (pVar1 = psa_hash_update(&local_110,input,input_length), pVar1 == 0)) &&
     (pVar1 = psa_hash_verify(&local_110,hash,hash_length), pVar1 == 0)) {
    pVar1 = psa_hash_abort(&local_110);
    return pVar1;
  }
  psa_hash_abort(&local_110);
  return pVar1;
}

Assistant:

psa_status_t psa_hash_compare( psa_algorithm_t alg,
                               const uint8_t *input, size_t input_length,
                               const uint8_t *hash, size_t hash_length )
{
    psa_hash_operation_t operation = PSA_HASH_OPERATION_INIT;
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;

    status = psa_hash_setup( &operation, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    status = psa_hash_update( &operation, input, input_length );
    if( status != PSA_SUCCESS )
        goto exit;
    status = psa_hash_verify( &operation, hash, hash_length );
    if( status != PSA_SUCCESS )
        goto exit;

exit:
    if( status == PSA_SUCCESS )
        status = psa_hash_abort( &operation );
    else
        psa_hash_abort( &operation );
    return( status );
}